

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::StreamingReporterBase<Catch::ConsoleReporter>::testGroupEnded
          (StreamingReporterBase<Catch::ConsoleReporter> *this,TestGroupStats *param_1)

{
  TestGroupStats *param_1_local;
  StreamingReporterBase<Catch::ConsoleReporter> *this_local;
  
  LazyStat<Catch::GroupInfo>::reset(&this->currentGroupInfo);
  return;
}

Assistant:

void testGroupEnded(TestGroupStats const& /* _testGroupStats */) override {
            currentGroupInfo.reset();
        }